

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

RectInfo * __thiscall
ImPlot::GetterHeatmap<long_long>::operator()
          (RectInfo *__return_storage_ptr__,GetterHeatmap<long_long> *this,int idx)

{
  long lVar1;
  ImU32 IVar2;
  float t_00;
  double dVar3;
  undefined1 auStack_38 [4];
  float t;
  ImPlotPoint p;
  int c;
  int r;
  double val;
  int idx_local;
  GetterHeatmap<long_long> *this_local;
  
  lVar1 = this->Values[idx];
  p.y._4_4_ = idx / this->Cols;
  p.y._0_4_ = idx % this->Cols;
  ImPlotPoint::ImPlotPoint
            ((ImPlotPoint *)auStack_38,
             (double)p.y._0_4_ * this->Width + this->XRef + (this->HalfSize).x,
             this->YDir * ((double)p.y._4_4_ * this->Height + (this->HalfSize).y) + this->YRef);
  RectInfo::RectInfo(__return_storage_ptr__);
  (__return_storage_ptr__->Min).x = _auStack_38 - (this->HalfSize).x;
  (__return_storage_ptr__->Min).y = p.x - (this->HalfSize).y;
  (__return_storage_ptr__->Max).x = _auStack_38 + (this->HalfSize).x;
  (__return_storage_ptr__->Max).y = p.x + (this->HalfSize).y;
  dVar3 = ImRemap01<double>((double)lVar1,this->ScaleMin,this->ScaleMax);
  t_00 = ImClamp<float>((float)dVar3,0.0,1.0);
  IVar2 = ImPlotColormapData::LerpTable(&GImPlot->ColormapData,(GImPlot->Style).Colormap,t_00);
  __return_storage_ptr__->Color = IVar2;
  return __return_storage_ptr__;
}

Assistant:

inline RectInfo operator()(int idx) const {
        double val = (double)Values[idx];
        const int r = idx / Cols;
        const int c = idx % Cols;
        const ImPlotPoint p(XRef + HalfSize.x + c*Width, YRef + YDir * (HalfSize.y + r*Height));
        RectInfo rect;
        rect.Min.x = p.x - HalfSize.x;
        rect.Min.y = p.y - HalfSize.y;
        rect.Max.x = p.x + HalfSize.x;
        rect.Max.y = p.y + HalfSize.y;
        const float t = ImClamp((float)ImRemap01(val, ScaleMin, ScaleMax),0.0f,1.0f);
        rect.Color = GImPlot->ColormapData.LerpTable(GImPlot->Style.Colormap, t);
        return rect;
    }